

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadPool.h
# Opt level: O1

void __thiscall ThreadPool<int,_8UL>::addTask(ThreadPool<int,_8UL> *this,int *value)

{
  int *piVar1;
  unique_lock<std::mutex> mutexLock;
  unique_lock<std::mutex> local_28;
  
  local_28._M_device = &this->queueMutex;
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  piVar1 = (this->tasks).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (piVar1 == (this->tasks).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
              ((deque<int,std::allocator<int>> *)&this->tasks,value);
  }
  else {
    *piVar1 = *value;
    (this->tasks).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
    _M_finish._M_cur = piVar1 + 1;
  }
  std::condition_variable::notify_one();
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return;
}

Assistant:

void addTask(const T& value)
    {
        std::unique_lock<std::mutex> mutexLock(queueMutex);
        tasks.push(value);
        condition.notify_one();
    }